

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::CountBitsFunction::CountBitsFunction(CountBitsFunction *this)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,CountBits,Function);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_005f0b68;
  return;
}

Assistant:

CountBitsFunction() : SystemSubroutine(KnownSystemName::CountBits, SubroutineKind::Function) {}